

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void google::protobuf::DynamicMessageFactory::ConstructDefaultOneofInstance
               (Descriptor *type,uint32 *offsets,void *default_oneof_or_weak_instance)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  int32 iVar4;
  uint32 uVar5;
  OneofDescriptor *pOVar6;
  FieldDescriptor *this;
  char *pcVar7;
  ArenaStringPtr *this_00;
  EnumValueDescriptor *this_01;
  FieldOptions *this_02;
  string *psVar8;
  int __c;
  float fVar9;
  ArenaStringPtr *asp;
  void *field_ptr;
  FieldDescriptor *field;
  int j;
  int i;
  void *default_oneof_or_weak_instance_local;
  uint32 *offsets_local;
  Descriptor *type_local;
  
  for (field._4_4_ = 0; iVar2 = Descriptor::oneof_decl_count(type), field._4_4_ < iVar2;
      field._4_4_ = field._4_4_ + 1) {
    field._0_4_ = 0;
    while( true ) {
      pOVar6 = Descriptor::oneof_decl(type,field._4_4_);
      iVar2 = OneofDescriptor::field_count(pOVar6);
      if (iVar2 <= (int)(uint)field) break;
      pOVar6 = Descriptor::oneof_decl(type,field._4_4_);
      pcVar7 = (char *)(ulong)(uint)field;
      this = OneofDescriptor::field(pOVar6,(uint)field);
      pcVar7 = FieldDescriptor::index(this,pcVar7,__c);
      this_00 = (ArenaStringPtr *)
                ((long)default_oneof_or_weak_instance + (ulong)offsets[(int)pcVar7]);
      CVar3 = FieldDescriptor::cpp_type(this);
      switch(CVar3) {
      case CPPTYPE_INT32:
        iVar4 = FieldDescriptor::default_value_int32(this);
        *(int32 *)&this_00->ptr_ = iVar4;
        break;
      case CPPTYPE_INT64:
        psVar8 = (string *)FieldDescriptor::default_value_int64(this);
        this_00->ptr_ = psVar8;
        break;
      case CPPTYPE_UINT32:
        uVar5 = FieldDescriptor::default_value_uint32(this);
        *(uint32 *)&this_00->ptr_ = uVar5;
        break;
      case CPPTYPE_UINT64:
        psVar8 = (string *)FieldDescriptor::default_value_uint64(this);
        this_00->ptr_ = psVar8;
        break;
      case CPPTYPE_DOUBLE:
        psVar8 = (string *)FieldDescriptor::default_value_double(this);
        this_00->ptr_ = psVar8;
        break;
      case CPPTYPE_FLOAT:
        fVar9 = FieldDescriptor::default_value_float(this);
        *(float *)&this_00->ptr_ = fVar9;
        break;
      case CPPTYPE_BOOL:
        bVar1 = FieldDescriptor::default_value_bool(this);
        *(bool *)&this_00->ptr_ = bVar1;
        break;
      case CPPTYPE_ENUM:
        this_01 = FieldDescriptor::default_value_enum(this);
        iVar2 = EnumValueDescriptor::number(this_01);
        *(int *)&this_00->ptr_ = iVar2;
        break;
      case CPPTYPE_STRING:
        this_02 = FieldDescriptor::options(this);
        FieldOptions::ctype(this_02);
        memset(this_00,0,8);
        psVar8 = FieldDescriptor::default_value_string_abi_cxx11_(this);
        internal::ArenaStringPtr::UnsafeSetDefault(this_00,psVar8);
        break;
      case CPPTYPE_MESSAGE:
        this_00->ptr_ = (string *)0x0;
      }
      field._0_4_ = (uint)field + 1;
    }
  }
  return;
}

Assistant:

void DynamicMessageFactory::ConstructDefaultOneofInstance(
    const Descriptor* type,
    const uint32 offsets[],
    void* default_oneof_or_weak_instance) {
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      void* field_ptr = reinterpret_cast<uint8*>(
          default_oneof_or_weak_instance) + offsets[field->index()];
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                                      \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                        \
          new(field_ptr) TYPE(field->default_value_##TYPE());           \
          break;

        HANDLE_TYPE(INT32 , int32 );
        HANDLE_TYPE(INT64 , int64 );
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT , float );
        HANDLE_TYPE(BOOL  , bool  );
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          new(field_ptr) int(field->default_value_enum()->number());
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING:
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(&field->default_value_string());
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE: {
          new(field_ptr) Message*(NULL);
          break;
        }
      }
    }
  }
}